

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Read.cpp
# Opt level: O0

expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code> *
idx2::ReadChunkExponents
          (expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code> *__return_storage_ptr__,
          idx2_file *Idx2,decode_data *D,u64 Brick,i8 Level,i8 Subband)

{
  int iVar1;
  long lVar2;
  __syscall_slong_t _Var3;
  bool bVar4;
  ulong uVar5;
  bitstream *Output;
  allocator *Alloc;
  unsigned_long *Key;
  error<idx2::idx2_err_code> eVar6;
  byte local_3a9;
  undefined1 local_358 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:409:5)>
  __ScopeGuard__409;
  anon_class_8_1_a0eb12ef_for_Func __CleanUpFunc__409;
  buffer CompressedChunkExpsBuf;
  bitstream *ChunkExpStream;
  i32 PrevChunkOffset;
  i32 ChunkExpSize;
  i64 ChunkExpOffset;
  i32 ChunkPos;
  undefined2 local_300;
  bool bStack_2fe;
  anon_class_8_1_1e916d15 local_2e8;
  chunk_exp_cache *local_2e0;
  undefined2 local_2d8;
  undefined1 uStack_2d6;
  undefined5 uStack_2d5;
  undefined1 local_2d0 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:395:5)>
  __ScopeGuard__395;
  anon_class_8_1_3fcf61a8_for_Func __CleanUpFunc__395;
  FILE *Fp;
  timer IOTimer;
  chunk_exp_cache *ChunkExpCache;
  anon_class_1_0_00000001 local_281 [12];
  undefined5 uStack_275;
  iterator local_270;
  unsigned_long *local_250;
  iterator ChunkCacheIt;
  file_cache *FileCache;
  u64 ChunkAddress;
  anon_class_8_1_1e916d15 local_210 [2];
  undefined5 uStack_1fd;
  chunk_exp_cache *local_1f8;
  anon_class_8_1_32d6a57b local_1e8 [2];
  undefined5 uStack_1d5;
  error<idx2::idx2_err_code> local_1d0;
  undefined1 local_1c0 [8];
  error<idx2::idx2_err_code> Result;
  iterator FileCacheIt;
  file_id FileId;
  i8 Subband_local;
  i8 Level_local;
  u64 Brick_local;
  decode_data *D_local;
  idx2_file *Idx2_local;
  undefined1 local_120 [8];
  timespec End;
  i8 I;
  
  Key = (unsigned_long *)(ulong)(uint)(int)Level;
  FileId.Id._6_1_ = Subband;
  FileId.Id._7_1_ = Level;
  ConstructFilePath((file_id *)&FileCacheIt.Idx,Idx2,Brick,Level,Subband,0);
  Lookup<unsigned_long,idx2::file_cache>
            ((iterator *)&Result.Code,(idx2 *)&D->FileCacheTable,
             (hash_table<unsigned_long,_idx2::file_cache> *)&FileId.Name.Size,Key);
  eVar6 = ReadFileExponents(Idx2,D,FileId.Id._7_1_,(iterator *)&Result.Code,
                            (file_id *)&FileCacheIt.Idx);
  local_1d0.Msg = eVar6.Msg;
  local_1c0 = (undefined1  [8])local_1d0.Msg;
  local_1d0._8_2_ = eVar6._8_2_;
  Result.Msg._0_1_ = local_1d0.Code;
  Result.Msg._1_1_ = local_1d0.StackIdx;
  local_1d0.StrGened = eVar6.StrGened;
  Result.Msg._2_1_ = local_1d0.StrGened;
  local_1d0 = eVar6;
  bVar4 = error::operator_cast_to_bool((error *)local_1c0);
  if (bVar4) {
    if (*(char *)((long)&(FileCacheIt.Ht)->Keys +
                 (long)&(((FileCacheIt.Val)->ChunkOffsets).Buffer.Alloc)->_vptr_allocator) == '\x02'
       ) {
      if (0xf < FileId.Id._7_1_) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
      }
      uVar5 = (ulong)(Idx2->BricksPerChunk).Arr[(int)FileId.Id._7_1_];
      if (uVar5 == 0) {
        local_3a9 = 0xff;
      }
      else {
        lVar2 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        local_3a9 = 0x3f - ((byte)lVar2 ^ 0x3f);
      }
      FileCache = (file_cache *)
                  (((long)FileId.Id._7_1_ << 0x3c) +
                   (Brick >> (local_3a9 + (uVar5 != 1L << (local_3a9 & 0x3f)) & 0x3f)) * 0x40000 +
                  (long)((int)FileId.Id._6_1_ << 0xc));
      ChunkCacheIt.Idx = (i64)FileCacheIt.Key;
      Lookup<unsigned_long,idx2::chunk_exp_cache>
                (&local_270,(idx2 *)(FileCacheIt.Key + 0xc),
                 (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)&FileCache,(unsigned_long *)0x0
                );
      local_250 = local_270.Key;
      ChunkCacheIt.Key = (unsigned_long *)local_270.Val;
      ChunkCacheIt.Val = (chunk_exp_cache *)local_270.Ht;
      ChunkCacheIt.Ht = (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)local_270.Idx;
      if (*(char *)((long)(unsigned_long **)local_270.Idx +
                   (((bitstream *)&(local_270.Ht)->Vals)->Stream).Bytes) == '\x02') {
        IOTimer.Start.tv_nsec = (__syscall_slong_t)local_270.Val;
        if (((local_270.Val)->ChunkExpStream).Stream.Bytes == 0) {
          clock_gettime(1,(timespec *)&Fp);
          __CleanUpFunc__395.Fp = (FILE **)fopen((char *)FileCacheIt.Idx,"rb");
          __ScopeGuard__395._8_8_ = &__CleanUpFunc__395;
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:395:5)>
          ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:395:5)>
                         *)local_2d0,
                        (anon_class_8_1_3fcf61a8_for_Func *)&__ScopeGuard__395.Dismissed);
          if (__CleanUpFunc__395.Fp == (FILE **)0x0) {
            local_2e8.FileId = (file_id *)&FileCacheIt.Idx;
            eVar6 = ReadChunkExponents::anon_class_8_1_1e916d15::operator()(&local_2e8);
            local_2e0 = (chunk_exp_cache *)eVar6.Msg;
            local_300 = eVar6._8_2_;
            local_2d8 = local_300;
            bStack_2fe = eVar6.StrGened;
            uStack_2d6 = bStack_2fe;
            __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002bfb90;
            (__return_storage_ptr__->field_1).Val = local_2e0;
            *(ulong *)((long)&__return_storage_ptr__->field_1 + 8) =
                 CONCAT53(uStack_2d5,eVar6._8_3_);
            __return_storage_ptr__->Ok = false;
            bVar4 = true;
          }
          else {
            iVar1 = *(int *)IOTimer.Start.tv_nsec;
            _PrevChunkOffset = *(long *)(ChunkCacheIt.Idx + 0xc0);
            ChunkExpStream._4_4_ = *(int *)(*(long *)(ChunkCacheIt.Idx + 0x90) + (long)iVar1 * 4);
            if (0 < iVar1) {
              iVar1 = *(int *)(*(long *)(ChunkCacheIt.Idx + 0x90) + (long)(iVar1 + -1) * 4);
              _PrevChunkOffset = iVar1 + _PrevChunkOffset;
              ChunkExpStream._4_4_ = ChunkExpStream._4_4_ - iVar1;
            }
            fseeko((FILE *)__CleanUpFunc__395.Fp,_PrevChunkOffset,0);
            _Var3 = IOTimer.Start.tv_nsec;
            Output = (bitstream *)(IOTimer.Start.tv_nsec + 8);
            Mallocator();
            __CleanUpFunc__409.CompressedChunkExpsBuf = (buffer *)0x0;
            __ScopeGuard__409._8_8_ = &__CleanUpFunc__409;
            scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:409:5)>
            ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:409:5)>
                           *)local_358,
                          (anon_class_8_1_a0eb12ef_for_Func *)&__ScopeGuard__409.Dismissed);
            Alloc = &Mallocator()->super_allocator;
            AllocBuf((buffer *)&__CleanUpFunc__409,(long)ChunkExpStream._4_4_,Alloc);
            fread(__CleanUpFunc__409.CompressedChunkExpsBuf,(long)ChunkExpStream._4_4_,1,
                  (FILE *)__CleanUpFunc__395.Fp);
            DecompressBufZstd((buffer *)&__CleanUpFunc__409,Output);
            std::__atomic_base<unsigned_long>::operator+=
                      (&(D->BytesDecoded_).super___atomic_base<unsigned_long>,
                       (long)ChunkExpStream._4_4_);
            std::__atomic_base<unsigned_long>::operator+=
                      (&(D->BytesExps_).super___atomic_base<unsigned_long>,
                       (long)ChunkExpStream._4_4_);
            End.tv_nsec = (__syscall_slong_t)&Fp;
            clock_gettime(1,(timespec *)local_120);
            std::__atomic_base<unsigned_long>::operator+=
                      (&(D->DecodeIOTime_).super___atomic_base<unsigned_long>,
                       (long)((double)((long)local_120 - *(long *)End.tv_nsec) * 1000000000.0 +
                             (double)(End.tv_sec - *(long *)(End.tv_nsec + 8))));
            (Output->Stream).Data = (Output->Stream).Data;
            *(undefined8 *)(_Var3 + 0x10) = *(undefined8 *)(_Var3 + 0x10);
            *(undefined8 *)(_Var3 + 0x18) = *(undefined8 *)(_Var3 + 0x18);
            *(byte **)(_Var3 + 0x20) = (Output->Stream).Data;
            *(undefined4 *)(_Var3 + 0x30) = 0;
            *(undefined8 *)(_Var3 + 0x28) = 0;
            *(long *)(_Var3 + 0x20) = *(long *)(_Var3 + 0x20) + (long)(*(int *)(_Var3 + 0x30) >> 3);
            *(undefined8 *)(_Var3 + 0x28) = **(undefined8 **)(_Var3 + 0x20);
            *(uint *)(_Var3 + 0x30) = *(uint *)(_Var3 + 0x30) & 7;
            scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:409:5)>
            ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:409:5)>
                            *)local_358);
            bVar4 = false;
          }
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:395:5)>
          ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:395:5)>
                          *)local_2d0);
          if (bVar4) {
            return __return_storage_ptr__;
          }
        }
        __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002bfb90;
        (__return_storage_ptr__->field_1).Err.Msg = (cstr)ChunkCacheIt.Key;
        __return_storage_ptr__->Ok = true;
      }
      else {
        eVar6 = ReadChunkExponents::anon_class_1_0_00000001::operator()(local_281);
        ChunkExpCache = (chunk_exp_cache *)eVar6.Msg;
        __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002bfb90;
        (__return_storage_ptr__->field_1).Val = ChunkExpCache;
        *(ulong *)((long)&__return_storage_ptr__->field_1 + 8) = CONCAT53(uStack_275,eVar6._8_3_);
        __return_storage_ptr__->Ok = false;
      }
    }
    else {
      local_210[0].FileId = (file_id *)&FileCacheIt.Idx;
      eVar6 = ReadChunkExponents::anon_class_8_1_1e916d15::operator()(local_210);
      ChunkAddress = (u64)eVar6.Msg;
      __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002bfb90;
      (__return_storage_ptr__->field_1).Val = (chunk_exp_cache *)ChunkAddress;
      *(ulong *)((long)&__return_storage_ptr__->field_1 + 8) = CONCAT53(uStack_1fd,eVar6._8_3_);
      __return_storage_ptr__->Ok = false;
    }
  }
  else {
    local_1e8[0].Result = (error<idx2::idx2_err_code> *)local_1c0;
    eVar6 = ReadChunkExponents::anon_class_8_1_32d6a57b::operator()(local_1e8);
    local_1f8 = (chunk_exp_cache *)eVar6.Msg;
    __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002bfb90;
    (__return_storage_ptr__->field_1).Val = local_1f8;
    *(ulong *)((long)&__return_storage_ptr__->field_1 + 8) = CONCAT53(uStack_1d5,eVar6._8_3_);
    __return_storage_ptr__->Ok = false;
  }
  return __return_storage_ptr__;
}

Assistant:

expected<const chunk_exp_cache*, idx2_err_code>
ReadChunkExponents(const idx2_file& Idx2, decode_data* D, u64 Brick, i8 Level, i8 Subband)
{
#if VISUS_IDX2
  if (Idx2.external_read)
  {
    u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, ExponentBitPlane_);
    auto ChunkExpCacheIt = Lookup(D->FileCache.ChunkExpCaches, ChunkAddress);
    if (ChunkExpCacheIt)
      return ChunkExpCacheIt.Val;

    //read the block
    // TOOD: who manages the memory for buff? (when do I deallocate it?)
    buffer buff;
    bool Result = Idx2.external_read(Idx2, buff, ChunkAddress).get();
    if (!Result)
      idx2_ReturnErrorIf(!Result, idx2_err_code::ChunkNotFound);

    //decompress the block
    chunk_exp_cache ChunkExpCache;
    bitstream& ChunkExpStream = ChunkExpCache.ChunkExpStream;
    DecompressBufZstd(buff, &ChunkExpStream);
    DeallocBuf(&buff);
    InitRead(&ChunkExpCache.ChunkExpStream, ChunkExpStream.Stream);
    Insert(&ChunkExpCacheIt, ChunkAddress, ChunkExpCache);
    return ChunkExpCacheIt.Val;
  }
#endif

  file_id FileId = ConstructFilePath(Idx2, Brick, Level, Subband, ExponentBitPlane_);
  auto FileCacheIt = Lookup(D->FileCacheTable, FileId.Id);
  idx2_PropagateIfError(ReadFileExponents(Idx2, D, Level, &FileCacheIt, FileId));
  if (!FileCacheIt)
    return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);

  /* find the appropriate chunk */
  u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, ExponentBitPlane_);
  file_cache* FileCache = FileCacheIt.Val;
  decltype(FileCache->ChunkExpCaches)::iterator ChunkCacheIt;
  ChunkCacheIt = Lookup(FileCache->ChunkExpCaches, ChunkAddress);
  if (!ChunkCacheIt)
    return idx2_Error(idx2_err_code::ChunkNotFound);

  chunk_exp_cache* ChunkExpCache = ChunkCacheIt.Val;
  if (Size(ChunkExpCache->ChunkExpStream.Stream) == 0) // chunk has not been loaded
  {
    timer IOTimer;
    StartTimer(&IOTimer);
    idx2_RAII(FILE*, Fp = fopen(FileId.Name.ConstPtr, "rb"), , if (Fp) fclose(Fp));
    if (!Fp)
      return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);
    i32 ChunkPos = ChunkExpCache->ChunkPos;
    i64 ChunkExpOffset = FileCache->ExponentBeginOffset;
    i32 ChunkExpSize = FileCache->ChunkExpOffsets[ChunkPos];
    if (ChunkPos > 0)
    {
      i32 PrevChunkOffset = FileCache->ChunkExpOffsets[ChunkPos - 1];
      ChunkExpOffset += PrevChunkOffset;
      ChunkExpSize -= PrevChunkOffset;
    }
    idx2_FSeek(Fp, ChunkExpOffset, SEEK_SET);
    bitstream& ChunkExpStream = ChunkExpCache->ChunkExpStream;
    idx2_ScopeBuffer(CompressedChunkExpsBuf, ChunkExpSize);
    ReadBuffer(Fp, &CompressedChunkExpsBuf, ChunkExpSize);
    DecompressBufZstd(CompressedChunkExpsBuf, &ChunkExpStream);
    D->BytesDecoded_ += ChunkExpSize;
    D->BytesExps_ += ChunkExpSize;
    D->DecodeIOTime_ += ElapsedTime(&IOTimer);
    InitRead(&ChunkExpStream, ChunkExpStream.Stream);
  }

  return ChunkCacheIt.Val;
}